

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree_test.cc
# Opt level: O1

btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>,_int_&,_int_*>
 __thiscall
phmap::priv::
base_checker<phmap::btree_set<int,phmap::Less<int>,std::allocator<int>>,std::set<int,std::less<int>,std::allocator<int>>>
::
iter_check<phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<int,phmap::Less<int>,std::allocator<int>,256,false>>,int&,int*>,std::_Rb_tree_const_iterator<int>>
          (base_checker<phmap::btree_set<int,phmap::Less<int>,std::allocator<int>>,std::set<int,std::less<int>,std::allocator<int>>>
           *this,btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>,_int_&,_int_*>
                 tree_iter,_Rb_tree_const_iterator<int> checker_iter)

{
  const_iterator cVar1;
  btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>,_int_&,_int_*>
  bVar2;
  
  cVar1 = btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>::
          end((btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>
               *)this);
  if (cVar1.position == tree_iter.position && cVar1.node == tree_iter.node) {
    if ((_Base_ptr)(this + 0x28) != checker_iter._M_node) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
                    ,0x7d,
                    "IterType phmap::priv::base_checker<phmap::btree_set<int>, std::set<int>>::iter_check(IterType, CheckerIterType) const [TreeType = phmap::btree_set<int>, CheckerType = std::set<int>, IterType = phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<int, phmap::Less<int>, std::allocator<int>, 256, false>>, int &, int *>, CheckerIterType = std::_Rb_tree_const_iterator<int>]"
                   );
    }
  }
  else {
    if (((undefined1  [16])tree_iter & (undefined1  [16])0x7) != (undefined1  [16])0x0) {
      __assert_fail("reinterpret_cast<uintptr_t>(p) % alignment == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap_base.h"
                    ,0xf84,
                    "CopyConst<Char, ElementType<N>> *phmap::priv::internal_layout::LayoutImpl<std::tuple<phmap::priv::btree_node<phmap::priv::set_params<int, phmap::Less<int>, std::allocator<int>, 256, false>> *, unsigned char, int, phmap::priv::btree_node<phmap::priv::set_params<int, phmap::Less<int>, std::allocator<int>, 256, false>> *>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>>::Pointer(Char *) const [Elements = std::tuple<phmap::priv::btree_node<phmap::priv::set_params<int, phmap::Less<int>, std::allocator<int>, 256, false>> *, unsigned char, int, phmap::priv::btree_node<phmap::priv::set_params<int, phmap::Less<int>, std::allocator<int>, 256, false>> *>, SizeSeq = phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, OffsetSeq = phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, N = 2UL, Char = char]"
                   );
    }
    if (*(_Rb_tree_color *)(tree_iter.node + (long)tree_iter.position * 4 + 0xc) !=
        checker_iter._M_node[1]._M_color) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
                    ,0x49,
                    "void phmap::priv::(anonymous namespace)::CheckPairEquals(const T &, const U &) [T = int, U = int]"
                   );
    }
  }
  bVar2._12_4_ = 0;
  bVar2.node = (btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>
                *)SUB128(tree_iter._0_12_,0);
  bVar2.position = SUB124(tree_iter._0_12_,8);
  return bVar2;
}

Assistant:

IterType iter_check(IterType tree_iter, CheckerIterType checker_iter) const {
        if (tree_iter == tree_.end()) {
            PHMAP_INTERNAL_CHECK(checker_iter == checker_.end(),
                                 "Checker iterator not at end.");
        } else {
            CheckPairEquals(*tree_iter, *checker_iter);
        }
        return tree_iter;
    }